

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O0

int __thiscall
cplus::socket::SocketServer::accept
          (SocketServer *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  sockaddr_in addr;
  int socket;
  AcceptFailedException *this_00;
  undefined4 in_register_00000034;
  uchar auVar1 [8];
  socklen_t local_2c;
  int new_server_socket;
  socklen_t length;
  sockaddr_in client_addr;
  SocketServer *this_local;
  
  auVar1._4_4_ = in_register_00000034;
  auVar1._0_4_ = __fd;
  client_addr.sin_zero = auVar1;
  memset(&new_server_socket,0,0x10);
  local_2c = 0x10;
  socket = ::accept(*(int *)((long)auVar1 + 0x18),(sockaddr *)&new_server_socket,&local_2c);
  if (socket < 0) {
    this_00 = (AcceptFailedException *)__cxa_allocate_exception();
    memset(this_00,0,0x838);
    AcceptFailedException::AcceptFailedException(this_00);
    __cxa_throw(this_00,&AcceptFailedException::typeinfo,
                AcceptFailedException::~AcceptFailedException);
  }
  addr.sin_zero = (uchar  [8])client_addr._0_8_;
  addr._0_8_ = _new_server_socket;
  Socket::Socket((Socket *)this,socket,addr,*(sockaddr_in *)((long)auVar1 + 8));
  return (int)this;
}

Assistant:

Socket SocketServer::accept() {
			//定义客户端的socket地址结构client_addr
			sockaddr_in client_addr{};
			socklen_t length = sizeof(client_addr);
			
			//接受一个到server_socket代表的socket的一个连接
			//如果没有连接请求,就等待到有连接请求--这是accept函数的特性
			//accept函数返回一个新的socket,这个socket(new_server_socket)用于同连接到的客户的通信
			//new_server_socket代表了服务器和客户端之间的一个通信通道
			//accept函数把连接到的客户端信息填写到客户端的socket地址结构client_addr中
			int new_server_socket = ::accept(server_socket, (struct sockaddr *) &client_addr, &length);
			if (new_server_socket < 0) {
				throw AcceptFailedException();
			}
			
			return {new_server_socket, client_addr, server_addr};
		}